

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

SMatrix<double,_3,_3> * __thiscall
gmath::SMatrix<double,_3,_3>::operator+
          (SMatrix<double,_3,_3> *__return_storage_ptr__,SMatrix<double,_3,_3> *this,
          SMatrix<double,_3,_3> *a)

{
  int k;
  long lVar1;
  double (*padVar2) [3];
  long lVar3;
  
  SMatrix(__return_storage_ptr__);
  padVar2 = (double (*) [3])__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(double (*) [3])*padVar2)[lVar3] =
           (*(double (*) [3])*(double (*) [3])this)[lVar3] +
           (*(double (*) [3])*(double (*) [3])a)[lVar3];
    }
    this = (SMatrix<double,_3,_3> *)((long)this + 0x18);
    a = (SMatrix<double,_3,_3> *)((long)a + 0x18);
    padVar2 = padVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

SMatrix<T, nrows, ncols> operator+(const SMatrix<T, nrows, ncols> &a) const
    {
      SMatrix<T, nrows, ncols> ret;

      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          ret.v[k][i]=v[k][i]+a.v[k][i];
        }

      return ret;
    }